

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O2

void crnd::crnd_set_memory_callbacks
               (crnd_realloc_func pRealloc,crnd_msize_func pMSize,void *pUser_data)

{
  code *pcVar1;
  code *pcVar2;
  
  pcVar2 = crnd_default_realloc;
  if (pRealloc != (crnd_realloc_func)0x0 && pMSize != (crnd_msize_func)0x0) {
    pcVar2 = pRealloc;
  }
  pcVar1 = crnd_default_msize;
  g_pUser_data = (void *)0x0;
  if (pRealloc != (crnd_realloc_func)0x0 && pMSize != (crnd_msize_func)0x0) {
    g_pUser_data = pUser_data;
    pcVar1 = pMSize;
  }
  g_pRealloc = pcVar2;
  g_pMSize = pcVar1;
  return;
}

Assistant:

void crnd_set_memory_callbacks(crnd_realloc_func pRealloc, crnd_msize_func pMSize, void* pUser_data)
    {
        if ((!pRealloc) || (!pMSize))
        {
            g_pRealloc = crnd_default_realloc;
            g_pMSize = crnd_default_msize;
            g_pUser_data = NULL;
        }
        else
        {
            g_pRealloc = pRealloc;
            g_pMSize = pMSize;
            g_pUser_data = pUser_data;
        }
    }